

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall defyx::Instruction::h_IXOR_M(Instruction *this,ostream *os)

{
  ostream *poVar1;
  uint uVar2;
  uint uVar3;
  Instruction *in_RSI;
  ostream *in_RDI;
  Instruction *unaff_retaddr;
  int srcIndex;
  int dstIndex;
  
  uVar2 = (uint)(byte)in_RDI[1] % 8;
  uVar3 = (uint)(byte)in_RDI[2] % 8;
  if (uVar2 == uVar3) {
    poVar1 = std::operator<<((ostream *)in_RSI,"r");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
    std::operator<<(poVar1,", ");
    genAddressImm(in_RSI,(ostream *)CONCAT44(uVar2,uVar3));
    std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)in_RSI,"r");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
    std::operator<<(poVar1,", ");
    genAddressReg(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20));
    std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Instruction::h_IXOR_M(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		if (dstIndex != srcIndex) {
			os << "r" << dstIndex << ", ";
			genAddressReg(os, srcIndex);
			os << std::endl;
		}
		else {
			os << "r" << dstIndex << ", ";
			genAddressImm(os);
			os << std::endl;
		}
	}